

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real.c
# Opt level: O1

void fft_r2c_exec(fft_real_object obj,double *inp,fft_data *oup)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  fft_object obj_00;
  fft_data *inp_00;
  fft_data *oup_00;
  size_t sVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  size_t __size;
  double dVar14;
  double dVar15;
  
  obj_00 = obj->cobj;
  iVar8 = obj_00->N;
  lVar13 = (long)iVar8;
  __size = lVar13 * 0x10;
  inp_00 = (fft_data *)malloc(__size);
  oup_00 = (fft_data *)malloc(__size);
  if (0 < lVar13) {
    sVar9 = 0;
    do {
      *(undefined8 *)((long)&inp_00->re + sVar9) = *(undefined8 *)((long)inp + sVar9);
      *(undefined8 *)((long)&inp_00->im + sVar9) = *(undefined8 *)((long)inp + sVar9 + 8);
      sVar9 = sVar9 + 0x10;
    } while (__size != sVar9);
  }
  fft_exec(obj_00,inp_00,oup_00);
  dVar1 = oup_00->re;
  dVar2 = oup_00->im;
  oup->re = dVar1 + dVar2;
  oup->im = 0.0;
  if (1 < iVar8) {
    lVar10 = __size - 0x10;
    lVar12 = 0x18;
    do {
      dVar3 = *(double *)((long)oup_00 + lVar12 + -8);
      dVar4 = *(double *)((long)&oup_00->re + lVar12);
      dVar5 = *(double *)((long)&oup_00->re + lVar10);
      dVar6 = *(double *)((long)&oup_00->im + lVar10);
      dVar14 = dVar4 + dVar6;
      dVar15 = dVar5 - dVar3;
      dVar7 = *(double *)((long)&obj->twiddle2[0].re + lVar12);
      *(double *)((long)oup + lVar12 + -8) =
           (dVar15 * dVar7 + *(double *)((long)obj->twiddle2 + lVar12 + -8) * dVar14 + dVar5 + dVar3
           ) * 0.5;
      *(double *)((long)&oup->re + lVar12) =
           ((dVar15 * *(double *)((long)obj->twiddle2 + lVar12 + -8) + (dVar4 - dVar6)) -
           dVar14 * dVar7) * 0.5;
      lVar12 = lVar12 + 0x10;
      lVar10 = lVar10 + -0x10;
    } while (lVar10 != 0);
  }
  oup[lVar13].re = dVar1 - dVar2;
  oup[lVar13].im = 0.0;
  if (1 < iVar8) {
    pdVar11 = &oup[(ulong)(uint)(iVar8 * 2) - 1].im;
    lVar13 = 0;
    do {
      ((fft_data *)(pdVar11 + -1))->re = *(double *)((long)&oup[1].re + lVar13);
      *pdVar11 = -*(double *)((long)&oup[1].im + lVar13);
      pdVar11 = pdVar11 + -2;
      lVar13 = lVar13 + 0x10;
    } while (__size - 0x10 != lVar13);
  }
  free(inp_00);
  free(oup_00);
  return;
}

Assistant:

void fft_r2c_exec(fft_real_object obj,fft_type *inp,fft_data *oup) {
	fft_data* cinp;
	fft_data* coup;
	int i,N2,N;
	fft_type temp1,temp2;
	N2 = obj->cobj->N;
	N = N2*2;
	
	cinp = (fft_data*) malloc (sizeof(fft_data) * N2);
	coup = (fft_data*) malloc (sizeof(fft_data) * N2);
	
	for (i = 0; i < N2; ++i) {
		cinp[i].re = inp[2*i];
		cinp[i].im = inp[2*i+1];
	}
	
	fft_exec(obj->cobj,cinp,coup);
	
	oup[0].re = coup[0].re + coup[0].im;
	oup[0].im = 0.0;
	
	for (i = 1; i < N2; ++i) {
		temp1 = coup[i].im + coup[N2-i].im ;
		temp2 = coup[N2-i].re - coup[i].re ;
		oup[i].re = (coup[i].re + coup[N2-i].re + (temp1 * obj->twiddle2[i].re) + (temp2 * obj->twiddle2[i].im)) / 2.0;
		oup[i].im = (coup[i].im - coup[N2-i].im + (temp2 * obj->twiddle2[i].re) - (temp1 * obj->twiddle2[i].im)) / 2.0;
	}
	
	
	
	oup[N2].re = coup[0].re - coup[0].im;
	oup[N2].im = 0.0;
	
	for (i = 1; i < N2;++i) {
		oup[N-i].re = oup[i].re; 
		oup[N-i].im = -oup[i].im; 
	}
	
		
	free(cinp);
	free(coup);

}